

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O1

void __thiscall
jetbrains::teamcity::TeamcityMessages::testFinished
          (TeamcityMessages *this,string *name,unsigned_long durationMs,string *flowId)

{
  pointer pcVar1;
  string *value;
  RaiiMessage msg;
  stringstream out;
  RaiiMessage local_210;
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&local_210,"testFinished",this->m_out);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar1,pcVar1 + name->_M_string_length);
  anon_unknown_1::RaiiMessage::writeProperty(&local_210,"name",&local_1e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (flowId->_M_dataplus)._M_p;
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_208,pcVar1,pcVar1 + flowId->_M_string_length);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&local_210,(char *)local_208,value);
  if (local_208[0] != local_1f8) {
    operator_delete(local_208[0],local_1f8[0] + 1);
  }
  std::__cxx11::stringstream::stringstream(local_1a8,_S_out);
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__cxx11::stringbuf::str();
  anon_unknown_1::RaiiMessage::writeProperty(&local_210,"duration",&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&local_210);
  return;
}

Assistant:

void TeamcityMessages::testFinished(const std::string& name, const unsigned long durationMs, const std::string& flowId)
{
    RaiiMessage msg("testFinished", *m_out);

    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);

    /// \bug W/ some locales it is possible to get a number w/ a number separator(s)!
    /// \todo Make a test for that!
    std::stringstream out(std::ios_base::out);
    out << durationMs;
    msg.writeProperty("duration", out.str());
}